

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLCoreRenderTarget.h
# Opt level: O3

void __thiscall
irr::video::
COpenGLCoreRenderTarget<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
::setTextures(COpenGLCoreRenderTarget<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
              *this,ITexture **textures,u32 numTextures,ITexture *depthStencil,
             E_CUBE_SURFACE *cubeSurfaces,u32 numCubeSurfaces)

{
  array<irr::video::ITexture_*> *__x;
  array<irr::video::E_CUBE_SURFACE> *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  code *pcVar2;
  _func_int *p_Var3;
  E_DRIVER_TYPE EVar4;
  bool bVar5;
  long lVar6;
  E_CUBE_SURFACE *pEVar7;
  int iVar8;
  uint uVar9;
  pointer ppIVar10;
  _func_int *p_Var11;
  pointer pEVar12;
  ulong uVar13;
  ITexture *pIVar14;
  dimension2d<unsigned_int> *pdVar15;
  pointer ppIVar16;
  pointer pEVar17;
  size_t __n;
  ulong uVar18;
  long lVar19;
  char *this_01;
  double in_XMM0_Qa;
  double extraout_XMM0_Qa;
  double __x_00;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  array<irr::video::ITexture_*> prevTextures;
  stringc message;
  vector<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_> local_70;
  undefined1 local_58;
  string<char> local_50;
  undefined4 extraout_var;
  
  ppIVar10 = (this->super_IRenderTarget).Textures.m_data.
             super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  ppIVar16 = (this->super_IRenderTarget).Textures.m_data.
             super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  __n = (long)ppIVar16 - (long)ppIVar10;
  uVar13 = (ulong)numCubeSurfaces;
  if (((long)__n >> 3 == (ulong)numTextures) &&
     ((ppIVar16 == ppIVar10 ||
      (iVar8 = bcmp(ppIVar10,textures,__n), in_XMM0_Qa = extraout_XMM0_Qa, iVar8 == 0)))) {
    pEVar12 = (this->super_IRenderTarget).CubeSurfaces.m_data.
              super__Vector_base<irr::video::E_CUBE_SURFACE,_std::allocator<irr::video::E_CUBE_SURFACE>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pEVar17 = (this->super_IRenderTarget).CubeSurfaces.m_data.
              super__Vector_base<irr::video::E_CUBE_SURFACE,_std::allocator<irr::video::E_CUBE_SURFACE>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    uVar18 = (long)pEVar17 - (long)pEVar12 >> 2;
    if (uVar18 != uVar13) goto LAB_001e8e6a;
    if (pEVar12 != pEVar17) {
      lVar19 = 0;
      do {
        if (*(int *)((long)pEVar12 + lVar19) != *(int *)((long)cubeSurfaces + lVar19))
        goto LAB_001e8e6a;
        lVar6 = lVar19 + 4;
        lVar19 = lVar19 + 4;
      } while ((pointer)((long)pEVar12 + lVar6) != pEVar17);
    }
    bVar5 = false;
  }
  else {
LAB_001e8e6a:
    __x = &(this->super_IRenderTarget).Textures;
    std::vector<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>::vector
              (&local_70,&__x->m_data);
    local_58 = (this->super_IRenderTarget).Textures.is_sorted;
    uVar9 = this->ColorAttachment;
    if (uVar9 < numTextures) {
      paVar1 = &local_50.str.field_2;
      local_50.str._M_string_length = 0;
      local_50.str.field_2._M_local_buf[0] = '\0';
      local_50.str._M_dataplus._M_p = (pointer)paVar1;
      core::string<char>::operator=(&local_50,"This GPU supports up to ");
      core::string<char>::operator+=(&local_50,this->ColorAttachment);
      __x_00 = (double)::std::__cxx11::string::append((char *)&local_50,0x2309f6);
      os::Printer::log((Printer *)local_50.str._M_dataplus._M_p,__x_00);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50.str._M_dataplus._M_p != paVar1) {
        operator_delete(local_50.str._M_dataplus._M_p,
                        CONCAT71(local_50.str.field_2._M_allocated_capacity._1_7_,
                                 local_50.str.field_2._M_local_buf[0]) + 1);
      }
      uVar9 = this->ColorAttachment;
    }
    if (uVar9 < numTextures) {
      numTextures = uVar9;
    }
    std::vector<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>::resize
              (&__x->m_data,(ulong)numTextures);
    ppIVar10 = (this->super_IRenderTarget).Textures.m_data.
               super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    if (((long)(this->super_IRenderTarget).Textures.m_data.
               super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>.
               _M_impl.super__Vector_impl_data._M_finish - (long)ppIVar10 & 0x7fffffff8U) != 0) {
      EVar4 = (this->super_IRenderTarget).DriverType;
      uVar18 = 0;
      do {
        pIVar14 = textures[uVar18];
        if (((pIVar14 == (ITexture *)0x0) || (pIVar14->DriverType != EVar4)) ||
           (*(int *)&pIVar14->field_0x84 == 0)) {
          ppIVar10[uVar18] = (ITexture *)0x0;
          ppIVar10 = (__x->m_data).
                     super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
        }
        else {
          ppIVar10[uVar18] = pIVar14;
          ppIVar10 = (__x->m_data).
                     super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          pcVar2 = (code *)((long)&(ppIVar10[uVar18]->NamedPath).Path.str._M_string_length +
                           (long)ppIVar10[uVar18]->_vptr_ITexture[0xfffffffffffffffd]);
          *(int *)pcVar2 = *(int *)pcVar2 + 1;
        }
        uVar18 = uVar18 + 1;
      } while (uVar18 < ((ulong)((long)(this->super_IRenderTarget).Textures.m_data.
                                       super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar10)
                         >> 3 & 0xffffffff));
    }
    ppIVar10 = local_70.
               super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    in_XMM0_Qa = extraout_XMM0_Qa_00;
    if (((long)local_70.
               super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>.
               _M_impl.super__Vector_impl_data._M_finish -
         (long)local_70.
               super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>.
               _M_impl.super__Vector_impl_data._M_start & 0x7fffffff8U) != 0) {
      uVar18 = 0;
      ppIVar16 = local_70.
                 super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      do {
        pIVar14 = ppIVar10[uVar18];
        if (pIVar14 != (ITexture *)0x0) {
          p_Var11 = pIVar14->_vptr_ITexture[-3];
          p_Var3 = (_func_int *)
                   ((long)&(pIVar14->NamedPath).Path.str._M_string_length + (long)p_Var11);
          *(int *)p_Var3 = *(int *)p_Var3 + -1;
          if (*(int *)p_Var3 == 0) {
            p_Var11 = (_func_int *)((long)&pIVar14->_vptr_ITexture + (long)p_Var11);
            in_XMM0_Qa = (double)(**(code **)(*(long *)p_Var11 + 8))(p_Var11);
            ppIVar16 = local_70.
                       super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            ppIVar10 = local_70.
                       super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>
                       ._M_impl.super__Vector_impl_data._M_start;
          }
        }
        uVar18 = uVar18 + 1;
      } while (uVar18 < ((ulong)((long)ppIVar16 - (long)ppIVar10) >> 3 & 0xffffffff));
    }
    this->RequestTextureUpdate = true;
    if (ppIVar10 != (pointer)0x0) {
      operator_delete(ppIVar10,(long)local_70.
                                     super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)ppIVar10);
      in_XMM0_Qa = extraout_XMM0_Qa_01;
    }
    pEVar12 = (this->super_IRenderTarget).CubeSurfaces.m_data.
              super__Vector_base<irr::video::E_CUBE_SURFACE,_std::allocator<irr::video::E_CUBE_SURFACE>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pEVar17 = (this->super_IRenderTarget).CubeSurfaces.m_data.
              super__Vector_base<irr::video::E_CUBE_SURFACE,_std::allocator<irr::video::E_CUBE_SURFACE>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    uVar18 = (long)pEVar17 - (long)pEVar12 >> 2;
    bVar5 = true;
  }
  pEVar7 = cubeSurfaces;
  if (uVar18 == uVar13) {
    for (; pEVar12 != pEVar17; pEVar12 = pEVar12 + 1) {
      if (*pEVar12 != *pEVar7) goto LAB_001e904d;
      pEVar7 = pEVar7 + 1;
    }
  }
  else {
LAB_001e904d:
    this_00 = &(this->super_IRenderTarget).CubeSurfaces;
    std::vector<irr::video::E_CUBE_SURFACE,_std::allocator<irr::video::E_CUBE_SURFACE>_>::resize
              (&this_00->m_data,uVar13);
    in_XMM0_Qa = extraout_XMM0_Qa_02;
    if (numCubeSurfaces != 0) {
      memmove((this_00->m_data).
              super__Vector_base<irr::video::E_CUBE_SURFACE,_std::allocator<irr::video::E_CUBE_SURFACE>_>
              ._M_impl.super__Vector_impl_data._M_start,cubeSurfaces,uVar13 << 2);
      in_XMM0_Qa = extraout_XMM0_Qa_03;
    }
    (this->super_IRenderTarget).CubeSurfaces.is_sorted = false;
    this->RequestTextureUpdate = true;
  }
  pIVar14 = (this->super_IRenderTarget).DepthStencil;
  if (pIVar14 == depthStencil) {
    if (!bVar5) {
      return;
    }
    goto LAB_001e9125;
  }
  if (pIVar14 != (ITexture *)0x0) {
    p_Var11 = pIVar14->_vptr_ITexture[-3];
    p_Var3 = (_func_int *)((long)&(pIVar14->NamedPath).Path.str._M_string_length + (long)p_Var11);
    *(int *)p_Var3 = *(int *)p_Var3 + -1;
    if (*(int *)p_Var3 == 0) {
      in_XMM0_Qa = (double)(**(code **)(*(long *)((long)&pIVar14->_vptr_ITexture + (long)p_Var11) +
                                       8))();
    }
    (this->super_IRenderTarget).DepthStencil = (ITexture *)0x0;
  }
  if ((depthStencil != (ITexture *)0x0) &&
     (depthStencil->DriverType == (this->super_IRenderTarget).DriverType)) {
    if (depthStencil->Type == ETT_2D) {
      if ((*(int *)&depthStencil->field_0x84 != 0) && (depthStencil->ColorFormat - ECF_D16 < 3)) {
        (this->super_IRenderTarget).DepthStencil = depthStencil;
        p_Var3 = (_func_int *)
                 ((long)&(depthStencil->NamedPath).Path.str._M_string_length +
                 (long)depthStencil->_vptr_ITexture[-3]);
        *(int *)p_Var3 = *(int *)p_Var3 + 1;
        goto LAB_001e9121;
      }
      this_01 = "Ignoring depth/stencil texture without depth color format.";
    }
    else {
      this_01 = "This driver doesn\'t support depth/stencil to cubemaps.";
    }
    os::Printer::log((Printer *)this_01,in_XMM0_Qa);
  }
LAB_001e9121:
  this->RequestDepthStencilUpdate = true;
LAB_001e9125:
  ppIVar10 = (this->super_IRenderTarget).Textures.m_data.
             super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  uVar13 = (long)(this->super_IRenderTarget).Textures.m_data.
                 super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar10;
  if ((uVar13 & 0x7fffffff8) != 0) {
    uVar18 = 0;
    do {
      pIVar14 = ppIVar10[uVar18];
      if (pIVar14 != (ITexture *)0x0) goto LAB_001e9157;
      uVar18 = uVar18 + 1;
    } while ((uVar13 >> 3 & 0xffffffff) != uVar18);
  }
  pIVar14 = (this->super_IRenderTarget).DepthStencil;
  if (pIVar14 == (ITexture *)0x0) {
    iVar8 = (*(this->Driver->super_CNullDriver).super_IVideoDriver._vptr_IVideoDriver[0x3b])();
    pdVar15 = (dimension2d<unsigned_int> *)CONCAT44(extraout_var,iVar8);
  }
  else {
LAB_001e9157:
    pdVar15 = &pIVar14->Size;
  }
  this->Size = *pdVar15;
  return;
}

Assistant:

void setTextures(ITexture *const *textures, u32 numTextures, ITexture *depthStencil, const E_CUBE_SURFACE *cubeSurfaces, u32 numCubeSurfaces) override
	{
		bool needSizeUpdate = false;

		// Set color attachments.
		if (!Textures.equals(textures, numTextures) || !CubeSurfaces.equals(cubeSurfaces, numCubeSurfaces)) {
			needSizeUpdate = true;

			core::array<ITexture *> prevTextures(Textures);

			if (numTextures > static_cast<u32>(ColorAttachment)) {
				core::stringc message = "This GPU supports up to ";
				message += static_cast<u32>(ColorAttachment);
				message += " textures per render target.";

				os::Printer::log(message.c_str(), ELL_WARNING);
			}

			Textures.set_used(core::min_(numTextures, static_cast<u32>(ColorAttachment)));

			for (u32 i = 0; i < Textures.size(); ++i) {
				TOpenGLTexture *currentTexture = (textures[i] && textures[i]->getDriverType() == DriverType) ? static_cast<TOpenGLTexture *>(textures[i]) : 0;

				GLuint textureID = 0;

				if (currentTexture) {
					textureID = currentTexture->getOpenGLTextureName();
				}

				if (textureID != 0) {
					Textures[i] = textures[i];
					Textures[i]->grab();
				} else {
					Textures[i] = 0;
				}
			}

			for (u32 i = 0; i < prevTextures.size(); ++i) {
				if (prevTextures[i])
					prevTextures[i]->drop();
			}

			RequestTextureUpdate = true;
		}

		if (!CubeSurfaces.equals(cubeSurfaces, numCubeSurfaces)) {
			CubeSurfaces.set_data(cubeSurfaces, numCubeSurfaces);
			RequestTextureUpdate = true;
		}

		// Set depth and stencil attachments.
		if (DepthStencil != depthStencil) {
			if (DepthStencil) {
				DepthStencil->drop();
				DepthStencil = 0;
			}

			needSizeUpdate = true;
			TOpenGLTexture *currentTexture = (depthStencil && depthStencil->getDriverType() == DriverType) ? static_cast<TOpenGLTexture *>(depthStencil) : 0;

			if (currentTexture) {
				if (currentTexture->getType() == ETT_2D) {
					GLuint textureID = currentTexture->getOpenGLTextureName();

					const ECOLOR_FORMAT textureFormat = (textureID != 0) ? depthStencil->getColorFormat() : ECF_UNKNOWN;
					if (IImage::isDepthFormat(textureFormat)) {
						DepthStencil = depthStencil;
						DepthStencil->grab();
					} else {
						os::Printer::log("Ignoring depth/stencil texture without depth color format.", ELL_WARNING);
					}
				} else {
					os::Printer::log("This driver doesn't support depth/stencil to cubemaps.", ELL_WARNING);
				}
			}

			RequestDepthStencilUpdate = true;
		}

		if (needSizeUpdate) {
			// Set size required for a viewport.

			ITexture *firstTexture = getTexture();

			if (firstTexture)
				Size = firstTexture->getSize();
			else {
				if (DepthStencil)
					Size = DepthStencil->getSize();
				else
					Size = Driver->getScreenSize();
			}
		}
	}